

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O1

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams2Der::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string *in_RCX;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  anon_unknown_0::CertErrorParams2Der::AppendDer
            (*(CertErrorParams2Der **)((long)this + 8),(char *)((long)this + 0x10),
             __return_storage_ptr__,in_RCX);
  if (*(long *)((long)this + 0x30) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    anon_unknown_0::CertErrorParams2Der::AppendDer
              (*(CertErrorParams2Der **)((long)this + 0x30),(char *)((long)this + 0x38),
               __return_storage_ptr__,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    std::string result;
    AppendDer(name1_, der1_, &result);
    if (name2_) {
      result += "\n";
      AppendDer(name2_, der2_, &result);
    }
    return result;
  }